

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

bool bloaty::anon_unknown_0::IsObjectFile(string_view data)

{
  string_view data_00;
  bool bVar1;
  Elf64_Ehdr *pEVar2;
  char *in_RDI;
  ElfFile elf;
  bool local_132;
  bool local_131;
  ElfFile *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  string_view in_stack_fffffffffffffef8;
  
  data_00._M_str = in_RDI;
  data_00._M_len = in_stack_fffffffffffffed8;
  ElfFile::ElfFile(in_stack_fffffffffffffed0,data_00);
  bVar1 = IsArchiveFile(in_stack_fffffffffffffef8);
  local_131 = true;
  if (!bVar1) {
    bVar1 = ElfFile::IsOpen((ElfFile *)&stack0xfffffffffffffef0);
    local_132 = false;
    if (bVar1) {
      pEVar2 = ElfFile::header((ElfFile *)&stack0xfffffffffffffef0);
      local_132 = pEVar2->e_type == 1;
    }
    local_131 = local_132;
  }
  return local_131;
}

Assistant:

static bool IsObjectFile(string_view data) {
  ElfFile elf(data);
  return IsArchiveFile(data) || (elf.IsOpen() && elf.header().e_type == ET_REL);
}